

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbaReadVer.c
# Opt level: O1

int Prs_CreateFlopSetReset
              (Cba_Ntk_t *p,Prs_Ntk_t *pNtk,Vec_Int_t *vBox,int *pIndexSet,int *pIndexRst,
              int *pBitSet,int *pBitRst)

{
  int iVar1;
  Cba_Man_t *pCVar2;
  int *piVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  int Fill;
  int Fill_00;
  int Fill_01;
  int Fill_02;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 uVar8;
  long lVar9;
  long lVar10;
  int iVar11;
  int local_6c;
  int local_68;
  int local_64;
  
  pCVar2 = p->pDesign;
  if (0 < (pCVar2->vUsed2).nSize) {
    piVar3 = (pCVar2->vUsed2).pArray;
    lVar9 = 0;
    do {
      iVar11 = piVar3[lVar9];
      if (((long)iVar11 < 0) || ((pCVar2->vNameMap2).nSize <= iVar11)) goto LAB_003ba370;
      (pCVar2->vNameMap2).pArray[iVar11] = 0;
      lVar9 = lVar9 + 1;
    } while (lVar9 < (pCVar2->vUsed2).nSize);
  }
  (pCVar2->vUsed2).nSize = 0;
  uVar5 = Abc_NamStrFind(pCVar2->pStrs,"set");
  pCVar2 = p->pDesign;
  Vec_IntFillExtra(&pCVar2->vNameMap2,uVar5 + 1,Fill);
  if ((-1 < (int)uVar5) && ((int)uVar5 < (pCVar2->vNameMap2).nSize)) {
    if ((pCVar2->vNameMap2).pArray[uVar5] != 0) {
LAB_003ba38f:
      __assert_fail("Vec_IntGetEntry(&p->vNameMap2, i) == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/cba/cba.h"
                    ,0x328,"void Cba_ManSetMap2(Cba_Man_t *, int, int)");
    }
    Vec_IntFillExtra(&pCVar2->vNameMap2,uVar5 + 1,Fill_00);
    if ((int)uVar5 < (pCVar2->vNameMap2).nSize) {
      (pCVar2->vNameMap2).pArray[uVar5] = 1;
      Vec_IntPush(&pCVar2->vUsed2,uVar5);
      uVar5 = Abc_NamStrFind(p->pDesign->pStrs,"reset");
      pCVar2 = p->pDesign;
      Vec_IntFillExtra(&pCVar2->vNameMap2,uVar5 + 1,Fill_01);
      if (((int)uVar5 < 0) || ((pCVar2->vNameMap2).nSize <= (int)uVar5)) goto LAB_003ba351;
      if ((pCVar2->vNameMap2).pArray[uVar5] != 0) goto LAB_003ba38f;
      Vec_IntFillExtra(&pCVar2->vNameMap2,uVar5 + 1,Fill_02);
      if ((int)uVar5 < (pCVar2->vNameMap2).nSize) {
        (pCVar2->vNameMap2).pArray[uVar5] = 2;
        Vec_IntPush(&pCVar2->vUsed2,uVar5);
        local_6c = -1;
        local_64 = -1;
        local_68 = -1;
        iVar11 = -1;
        if (1 < vBox->nSize) {
          lVar9 = 1;
          local_68 = -1;
          local_64 = -1;
          local_6c = -1;
          uVar8 = extraout_RDX;
          iVar6 = -1;
          do {
            iVar7 = vBox->pArray[lVar9 + -1];
            lVar10 = (long)iVar7;
            iVar1 = vBox->pArray[lVar9];
            pCVar2 = p->pDesign;
            Vec_IntFillExtra(&pCVar2->vNameMap2,iVar7 + 1,(int)uVar8);
            if ((lVar10 < 0) || ((pCVar2->vNameMap2).nSize <= iVar7)) goto LAB_003ba351;
            uVar8 = extraout_RDX_00;
            iVar11 = iVar1;
            iVar4 = (int)lVar9;
            if ((pCVar2->vNameMap2).pArray[lVar10] != 1) {
              pCVar2 = p->pDesign;
              Vec_IntFillExtra(&pCVar2->vNameMap2,iVar7 + 1,(int)extraout_RDX_00);
              if ((pCVar2->vNameMap2).nSize <= iVar7) goto LAB_003ba351;
              uVar8 = extraout_RDX_01;
              iVar11 = iVar6;
              iVar4 = local_64;
              if ((pCVar2->vNameMap2).pArray[lVar10] == 2) {
                local_6c = iVar1;
                local_68 = (int)lVar9;
              }
            }
            local_64 = iVar4;
            lVar9 = lVar9 + 2;
            iVar6 = iVar11;
          } while ((int)lVar9 < vBox->nSize);
        }
        if ((-1 < iVar11) && (-1 < local_6c)) {
          if (pIndexSet != (int *)0x0) {
            *pBitSet = 0;
          }
          if (pIndexRst != (int *)0x0) {
            *pBitRst = 0;
          }
          if (pBitSet != (int *)0x0) {
            *pBitSet = 0;
          }
          if (pBitRst != (int *)0x0) {
            *pBitRst = 0;
          }
          iVar6 = Prs_CreateBitSignal(pNtk,iVar11);
          iVar7 = Prs_CreateBitSignal(pNtk,local_6c);
          iVar11 = 0;
          if ((iVar6 != -1) && (iVar11 = 0, iVar7 != -1)) {
            if (pIndexSet != (int *)0x0) {
              *pIndexSet = local_64;
            }
            if (pIndexRst != (int *)0x0) {
              *pIndexRst = local_68;
            }
            if (pBitSet != (int *)0x0) {
              *pBitSet = iVar6;
            }
            iVar11 = 1;
            if (pBitRst != (int *)0x0) {
              *pBitRst = iVar7;
            }
          }
          return iVar11;
        }
        __assert_fail("iSigSet >= 0 && iSigRst >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/cba/cbaReadVer.c"
                      ,0x6a5,
                      "int Prs_CreateFlopSetReset(Cba_Ntk_t *, Prs_Ntk_t *, Vec_Int_t *, int *, int *, int *, int *)"
                     );
      }
    }
LAB_003ba370:
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                  ,0x1c9,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
  }
LAB_003ba351:
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                ,0x1a7,"int Vec_IntEntry(Vec_Int_t *, int)");
}

Assistant:

int Prs_CreateFlopSetReset( Cba_Ntk_t * p, Prs_Ntk_t * pNtk, Vec_Int_t * vBox, int * pIndexSet, int * pIndexRst, int * pBitSet, int * pBitRst )
{
    int iSigSet = -1, iSigRst = -1;
    int IndexSet = -1, IndexRst = -1;
    int FormId, ActId, k;
    // mark set and reset
    Cba_NtkCleanMap2( p );
    Cba_NtkSetMap2( p, Cba_NtkStrId(p, "set"), 1 );
    Cba_NtkSetMap2( p, Cba_NtkStrId(p, "reset"), 2 );
    // check the inputs
    Vec_IntForEachEntryDouble( vBox, FormId, ActId, k )
        if ( Cba_NtkGetMap2(p, FormId) == 1 ) // set
            iSigSet = ActId, IndexSet = k+1;
        else if ( Cba_NtkGetMap2(p, FormId) == 2 ) // reset
            iSigRst = ActId, IndexRst = k+1;
    assert( iSigSet >= 0 && iSigRst >= 0 );
    if ( pIndexSet ) *pBitSet = 0;
    if ( pIndexRst ) *pBitRst = 0;
    if ( pBitSet )   *pBitSet = 0;
    if ( pBitRst )   *pBitRst = 0;
    if ( iSigSet == -1 || iSigRst == -1 )
        return 0;
    iSigSet = Prs_CreateBitSignal(pNtk, iSigSet);
    iSigRst = Prs_CreateBitSignal(pNtk, iSigRst);
    if ( iSigSet == -1 || iSigRst == -1 )
        return 0;
    if ( pIndexSet ) *pIndexSet = IndexSet;
    if ( pIndexRst ) *pIndexRst = IndexRst;
    if ( pBitSet )   *pBitSet = iSigSet;
    if ( pBitRst )   *pBitRst = iSigRst;
    return 1;
}